

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
llvm::cl::basic_parser_impl::printOptionInfo(basic_parser_impl *this,Option *O,size_t GlobalWidth)

{
  uint uVar1;
  Option *this_00;
  int iVar2;
  raw_ostream *prVar3;
  undefined4 extraout_var;
  size_t sVar5;
  size_t extraout_RDX;
  size_t in_R8;
  size_t sVar6;
  StringRef Str;
  StringRef Str_00;
  StringRef HelpStr;
  char *pcVar4;
  
  prVar3 = outs();
  prVar3 = raw_ostream::operator<<(prVar3,"  -");
  raw_ostream::operator<<(prVar3,O->ArgStr);
  iVar2 = (**this->_vptr_basic_parser_impl)(this);
  pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
  if (extraout_RDX != 0) {
    uVar1 = *(uint *)&O->field_0xc;
    prVar3 = outs();
    if ((uVar1 >> 10 & 1) == 0) {
      prVar3 = raw_ostream::operator<<(prVar3,"=<");
      sVar5 = (O->ValueStr).Length;
      sVar6 = extraout_RDX;
      if (sVar5 != 0) {
        pcVar4 = (O->ValueStr).Data;
        sVar6 = sVar5;
      }
      Str.Length = sVar6;
      Str.Data = pcVar4;
      prVar3 = raw_ostream::operator<<(prVar3,Str);
      raw_ostream::operator<<(prVar3,'>');
    }
    else {
      prVar3 = raw_ostream::operator<<(prVar3," <");
      sVar5 = (O->ValueStr).Length;
      sVar6 = extraout_RDX;
      if (sVar5 != 0) {
        pcVar4 = (O->ValueStr).Data;
        sVar6 = sVar5;
      }
      Str_00.Length = sVar6;
      Str_00.Data = pcVar4;
      prVar3 = raw_ostream::operator<<(prVar3,Str_00);
      raw_ostream::operator<<(prVar3,">...");
    }
  }
  this_00 = (Option *)(O->HelpStr).Data;
  pcVar4 = (char *)(O->HelpStr).Length;
  sVar5 = getOptionWidth(this,O);
  HelpStr.Length = GlobalWidth;
  HelpStr.Data = pcVar4;
  Option::printHelpStr(this_00,HelpStr,sVar5,in_R8);
  return;
}

Assistant:

void basic_parser_impl::printOptionInfo(const Option &O,
                                        size_t GlobalWidth) const {
  outs() << "  -" << O.ArgStr;

  auto ValName = getValueName();
  if (!ValName.empty()) {
    if (O.getMiscFlags() & PositionalEatsArgs) {
      outs() << " <" << getValueStr(O, ValName) << ">...";
    } else {
      outs() << "=<" << getValueStr(O, ValName) << '>';
    }
  }

  Option::printHelpStr(O.HelpStr, GlobalWidth, getOptionWidth(O));
}